

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O2

void __thiscall jrtplib::RTCPCompoundPacketBuilder::SDESSource::~SDESSource(SDESSource *this)

{
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  *this_00;
  RTPMemoryManager *in_RDX;
  RTPMemoryManager *extraout_RDX;
  _List_node_base *p_Var1;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__SDESSource_00145900;
  this_00 = &this->items;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)this_00) {
    if ((jrtplib *)p_Var1[1]._M_next != (jrtplib *)0x0) {
      RTPDeleteByteArray((jrtplib *)p_Var1[1]._M_next,(uint8_t *)(this->super_RTPMemoryObject).mgr,
                         in_RDX);
      in_RDX = extraout_RDX;
    }
  }
  std::__cxx11::
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ::clear(this_00);
  std::__cxx11::
  _List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ::_M_clear(&this_00->
              super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
            );
  return;
}

Assistant:

~SDESSource()
		{
			std::list<Buffer>::const_iterator it;
			for (it = items.begin() ; it != items.end() ; it++)
			{
				if ((*it).packetdata)
					RTPDeleteByteArray((*it).packetdata,GetMemoryManager());
			}
			items.clear();
		}